

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O3

string * __thiscall
absl::Substitute_abi_cxx11_
          (string *__return_storage_ptr__,absl *this,string_view format,Arg *a0,Arg *a1,Arg *a2)

{
  string_view format_00;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  
  format_00._M_len = format._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48 = *(undefined8 *)format._M_str;
  uStack_40 = *(undefined8 *)(format._M_str + 8);
  local_38 = (a0->piece_)._M_len;
  pcStack_30 = (a0->piece_)._M_str;
  local_28 = (a1->piece_)._M_len;
  pcStack_20 = (a1->piece_)._M_str;
  format_00._M_str = (char *)&local_48;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)this,format_00,
             (Nullable<const_absl::string_view_*>)0x3,(size_t)a1);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0,
    const substitute_internal::Arg& a1, const substitute_internal::Arg& a2) {
  std::string result;
  SubstituteAndAppend(&result, format, a0, a1, a2);
  return result;
}